

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundfiles.c
# Opt level: O1

int ps_config_wavfile(ps_config_t *config,FILE *infh,char *file)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  char *fmt;
  long lVar7;
  char *pcVar8;
  int iVar9;
  undefined8 uVar10;
  size_t __size;
  ulong __size_00;
  int16 shortval;
  int32 intval;
  char id [4];
  short local_3a;
  uint local_38;
  int local_34;
  
  pcVar8 = "(input filehandle)";
  if (file != (char *)0x0) {
    pcVar8 = file;
  }
  ps_config_set_str(config,"input_endian","little");
  sVar5 = fread(&local_34,1,4,(FILE *)infh);
  if (sVar5 == 4) {
    sVar5 = fread(&local_38,4,1,(FILE *)infh);
    if (sVar5 == 1) {
      sVar5 = fread(&local_34,1,4,(FILE *)infh);
      if (sVar5 == 4) {
        if (local_34 != 0x45564157) {
          fmt = "%s is not a WAVE file\n";
          lVar7 = 0x78;
          goto LAB_0010d4b5;
        }
        sVar5 = fread(&local_34,1,4,(FILE *)infh);
        if (sVar5 == 4) {
          if (local_34 != 0x20746d66) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                    ,0x7f,"Format chunk missing\n");
            return -1;
          }
          sVar5 = fread(&local_38,4,1,(FILE *)infh);
          uVar2 = local_38;
          if (sVar5 == 1) {
            sVar5 = fread(&local_3a,2,1,(FILE *)infh);
            if (sVar5 == 1) {
              if (local_3a != 1) {
                fmt = "%s is not in PCM format\n";
                lVar7 = 0x8c;
LAB_0010d4b5:
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                        ,lVar7,fmt,pcVar8);
                return -1;
              }
              sVar5 = fread(&local_3a,2,1,(FILE *)infh);
              if (sVar5 == 1) {
                if (local_3a != 1) {
                  fmt = "%s is not single channel\n";
                  lVar7 = 0x95;
                  goto LAB_0010d4b5;
                }
                sVar5 = fread(&local_38,4,1,(FILE *)infh);
                if (sVar5 == 1) {
                  lVar7 = ps_config_int(config,"samprate");
                  if (lVar7 == 0) {
                    ps_config_set_int(config,"samprate",(long)(int)local_38);
                  }
                  else {
                    lVar7 = ps_config_int(config,"samprate");
                    uVar3 = local_38;
                    if (lVar7 != (int)local_38) {
                      lVar7 = ps_config_int(config,"samprate");
                      err_msg(ERR_WARN,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                              ,0xa1,"WAVE file sampling rate %d != samprate %d\n",(ulong)uVar3,lVar7
                             );
                    }
                  }
                  sVar5 = fread(&local_38,4,1,(FILE *)infh);
                  if (sVar5 == 1) {
                    sVar5 = fread(&local_3a,2,1,(FILE *)infh);
                    if (sVar5 == 1) {
                      sVar5 = fread(&local_3a,2,1,(FILE *)infh);
                      if (sVar5 == 1) {
                        if (local_3a != 0x10) {
                          fmt = "%s is not 16-bit\n";
                          lVar7 = 0xae;
                          goto LAB_0010d4b5;
                        }
                        iVar9 = 0;
                        if (0x10 < (int)uVar2) {
                          __size_00 = (ulong)(uVar2 - 0x10);
                          pvVar6 = malloc(__size_00);
                          sVar5 = fread(pvVar6,1,__size_00,(FILE *)infh);
                          iVar9 = 0;
                          if (sVar5 != __size_00) {
                            err_msg_system(ERR_ERROR,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                           ,0xb8,"%s: Failed to read extra header",pcVar8);
                            iVar9 = -1;
                          }
                          ckd_free(pvVar6);
                          if (sVar5 != __size_00) {
                            return iVar9;
                          }
                        }
                        while( true ) {
                          sVar5 = fread(&local_34,1,4,(FILE *)infh);
                          iVar4 = local_34;
                          if (sVar5 != 4) {
                            lVar7 = 0xc2;
                            goto LAB_0010d503;
                          }
                          sVar5 = fread(&local_38,4,1,(FILE *)infh);
                          if (iVar4 == 0x61746164) break;
                          if (sVar5 == 1) {
                            __size = (size_t)(int)local_38;
                            pvVar6 = malloc(__size);
                            sVar5 = fread(pvVar6,1,__size,(FILE *)infh);
                            if (sVar5 != __size) {
                              err_msg_system(ERR_ERROR,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                             ,0xd1,"%s: Failed to read %s chunk",pcVar8,&local_34);
                              iVar9 = -1;
                            }
                            ckd_free(pvVar6);
                            bVar1 = iVar9 != -1;
                            iVar9 = -(uint)(iVar9 == -1);
                          }
                          else {
                            bVar1 = false;
                            err_msg_system(ERR_ERROR,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                           ,0xcc,"Failed to read %d bytes",4);
                            iVar9 = -1;
                          }
                          if (!bVar1) {
                            return iVar9;
                          }
                        }
                        if (sVar5 == 1) {
                          return iVar9;
                        }
                        lVar7 = 0xc5;
                        goto LAB_0010d503;
                      }
                      lVar7 = 0xab;
                    }
                    else {
                      lVar7 = 0xa8;
                    }
                    goto LAB_0010d6c5;
                  }
                  lVar7 = 0xa5;
                }
                else {
                  lVar7 = 0x9b;
                }
                goto LAB_0010d503;
              }
              lVar7 = 0x92;
            }
            else {
              lVar7 = 0x89;
            }
LAB_0010d6c5:
            uVar10 = 2;
            goto LAB_0010d50e;
          }
          lVar7 = 0x84;
        }
        else {
          lVar7 = 0x7d;
        }
      }
      else {
        lVar7 = 0x76;
      }
    }
    else {
      lVar7 = 0x74;
    }
  }
  else {
    lVar7 = 0x72;
  }
LAB_0010d503:
  uVar10 = 4;
LAB_0010d50e:
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                 ,lVar7,"Failed to read %d bytes",uVar10);
  return -1;
}

Assistant:

int
ps_config_wavfile(ps_config_t *config, FILE *infh, const char *file)
{
    char id[4];
    int32 intval, header_len;
    int16 shortval;
    int rv = 0;

    if (file == NULL)
        file = "(input filehandle)";
        
    /* RIFF files are little-endian by definition. */
    ps_config_set_str(config, "input_endian", "little");

    /* Read in all the header chunks and etcetera. */
    TRY_FREAD(id, 1, 4, infh);
    /* Total file length (we don't care) */
    TRY_FREAD(&intval, 4, 1, infh);
    /* 'WAVE' */
    TRY_FREAD(id, 1, 4, infh);
    if (0 != memcmp(id, "WAVE", 4)) {
        E_ERROR("%s is not a WAVE file\n", file);
        rv = -1;
        goto error_out;
    }
    /* 'fmt ' */
    TRY_FREAD(id, 1, 4, infh);
    if (0 != memcmp(id, "fmt ", 4)) {
        E_ERROR("Format chunk missing\n");
        rv = -1;
        goto error_out;
    }
    /* Length of 'fmt ' chunk */
    TRY_FREAD(&intval, 4, 1, infh);
    SWAP_LE_32(&intval);
    header_len = intval;

    /* Data format. */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 1) { /* PCM */
        E_ERROR("%s is not in PCM format\n", file);
        rv = -1;
        goto error_out;
    }

    /* Number of channels. */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 1) { /* PCM */
        E_ERROR("%s is not single channel\n", file);
        rv = -1;
        goto error_out;
    }

    /* Sampling rate (finally!) */
    TRY_FREAD(&intval, 4, 1, infh);
    SWAP_LE_32(&intval);
    if (ps_config_int(config, "samprate") == 0)
        ps_config_set_int(config, "samprate", intval);
    else if (ps_config_int(config, "samprate") != intval) {
        E_WARN("WAVE file sampling rate %d != samprate %d\n",
               intval, ps_config_int(config, "samprate"));
    }

    /* Average bytes per second (we don't care) */
    TRY_FREAD(&intval, 4, 1, infh);

    /* Block alignment (we don't care) */
    TRY_FREAD(&shortval, 2, 1, infh);

    /* Bits per sample (must be 16) */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 16) {
        E_ERROR("%s is not 16-bit\n", file);
        rv = -1;
        goto error_out;
    }

    /* Any extra parameters. */
    if (header_len > 16) {
        /* Avoid seeking... */
        char *spam = malloc(header_len - 16);
        if (fread(spam, 1, header_len - 16, infh) != (size_t)(header_len - 16)) {
            E_ERROR_SYSTEM("%s: Failed to read extra header", file);
            rv = -1;
        }
        ckd_free(spam);
        if (rv == -1)
            goto error_out;
    }

    /* Now skip to the 'data' chunk. */
    while (1) {
        TRY_FREAD(id, 1, 4, infh);
        if (0 == memcmp(id, "data", 4)) {
            /* Total number of bytes of data (we don't care). */
            TRY_FREAD(&intval, 4, 1, infh);
            break;
        }
        else {
            char *spam;
            /* Some other stuff... */
            /* Number of bytes of ... whatever */
            TRY_FREAD(&intval, 4, 1, infh);
            SWAP_LE_32(&intval);
            /* Avoid seeking... */
            spam = malloc(intval);
            if (fread(spam, 1, intval, infh) != (size_t)intval) {
                E_ERROR_SYSTEM("%s: Failed to read %s chunk", file, id);
                rv = -1;
            }
            ckd_free(spam);
            if (rv == -1)
                goto error_out;
        }
    }

error_out:
    return rv;
}